

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O3

void __thiscall
so_5::impl::local_mbox_details::subscriber_adaptive_container_t::switch_storage_to_vector
          (subscriber_adaptive_container_t *this)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  map_type empty_map;
  vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  local_58;
  _Rb_tree<so_5::agent_t_*,_std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>,_std::_Select1st<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  local_38;
  
  local_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_38._M_impl.super__Rb_tree_header._M_header;
  local_58.
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58.
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Rb_tree_header._M_header._M_right =
       local_38._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ::reserve(&local_58,(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  for_each<std::_Rb_tree_iterator<std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>>,so_5::impl::local_mbox_details::subscriber_adaptive_container_t::switch_storage_to_vector()::_lambda(std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>const&)_1_>
            ((this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_iterator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>
              )&(this->m_map)._M_t._M_impl.super__Rb_tree_header,&local_58);
  psVar1 = (this->m_vector).
           super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar2 = (this->m_vector).
           super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->m_vector).
           super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_start = psVar2;
  local_58.
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar3;
  local_58.
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar1;
  std::
  _Rb_tree<so_5::agent_t_*,_std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>,_std::_Select1st<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  ::swap(&(this->m_map)._M_t,&local_38);
  this->m_storage = vector;
  if (local_58.
      super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<so_5::agent_t_*,_std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>,_std::_Select1st<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  ::~_Rb_tree(&local_38);
  return;
}

Assistant:

void
	switch_storage_to_vector()
		{
			// All exceptions will be ignored.
			// It is because an exception can be thrown on staged 1-2-3,
			// but not on stage 4.
			try
				{
					// Stage 1. New containers to swap values with old containers.
					// An exception could be thrown in the constructors.
					map_type empty_map;
					vector_type new_storage;

					// Stage 2. Preallocate necessary space in the new vector.
					// An exception can be thrown here.
					new_storage.reserve( m_map.size() );

					// Stage 3. Copy items from old map to the new vector.
					// We do not expect exceptions here at v.5.5.12, but
					// the situation can change in the future versions.

					// Use the fact that items in map is already ordered.
					std::for_each( m_map.begin(), m_map.end(),
						[&new_storage]( const map_type::value_type & info ) {
							new_storage.push_back( info.second );
						} );

					// Stage 4. Swapping.
					// No exceptions expected here.
					m_vector.swap( new_storage );
					m_map.swap( empty_map );
					m_storage = storage_type::vector;
				}
			catch(...)
				{}
		}